

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3Atoi64(char *zNum,i64 *pNum,int length,u8 enc)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  undefined7 in_register_00000009;
  byte *pbVar9;
  byte *pbVar10;
  ulong uVar11;
  long lVar12;
  byte *pbVar13;
  long lVar14;
  i64 iVar15;
  i64 iVar16;
  bool bVar17;
  
  uVar7 = (uint)CONCAT71(in_register_00000009,enc);
  if (uVar7 == 1) {
    lVar14 = 1;
    bVar5 = false;
    pbVar9 = (byte *)zNum;
  }
  else {
    uVar11 = (ulong)(3 - uVar7);
    if ((int)(3 - uVar7) < length) {
      uVar11 = (ulong)(int)(3 - uVar7);
      do {
        if (zNum[uVar11] != '\0') {
          bVar5 = true;
          goto LAB_00140d99;
        }
        uVar11 = uVar11 + 2;
      } while ((long)uVar11 < (long)length);
    }
    bVar5 = false;
LAB_00140d99:
    length = (uint)uVar11 ^ 1;
    pbVar9 = (byte *)(zNum + (uVar7 & 1));
    lVar14 = 2;
  }
  pbVar13 = (byte *)(zNum + length);
  bVar4 = true;
  for (; pbVar10 = pbVar9, pbVar9 < pbVar13; pbVar9 = pbVar9 + lVar14) {
    bVar1 = *pbVar9;
    if ((""[bVar1] & 1) == 0) {
      if (bVar1 == 0x2b) {
        pbVar9 = pbVar9 + lVar14;
        pbVar10 = pbVar9;
      }
      else if (bVar1 == 0x2d) {
        pbVar9 = pbVar9 + lVar14;
        bVar4 = false;
        pbVar10 = pbVar9;
      }
      break;
    }
  }
  for (; (pbVar9 < pbVar13 && (*pbVar9 == 0x30)); pbVar9 = pbVar9 + lVar14) {
  }
  lVar12 = 0;
  uVar7 = 0;
  if (pbVar9 < pbVar13) {
    iVar15 = 0;
    do {
      bVar17 = (byte)(pbVar9[lVar12] - 0x30) < 10;
      if (!bVar17) break;
      iVar15 = (ulong)pbVar9[lVar12] + iVar15 * 10 + -0x30;
      lVar12 = lVar12 + lVar14;
    } while (pbVar9 + lVar12 < pbVar13);
    uVar7 = (uint)lVar12;
    if (iVar15 < 0) {
      iVar15 = 0x7fffffffffffffff;
      iVar16 = -0x8000000000000000;
      goto LAB_00140e58;
    }
  }
  else {
    bVar17 = true;
    iVar15 = 0;
  }
  iVar16 = -iVar15;
LAB_00140e58:
  if (bVar4) {
    iVar16 = iVar15;
  }
  *pNum = iVar16;
  if (uVar7 == 0) {
    bVar5 = (bool)(bVar5 | pbVar10 == pbVar9);
  }
  if (!bVar17 && bVar5 == false) {
    pbVar10 = pbVar9 + uVar7;
    do {
      bVar5 = (""[*pbVar10] & 1) == 0;
      if (bVar5) break;
      pbVar10 = pbVar10 + lVar14;
    } while (pbVar10 < pbVar13);
  }
  uVar3 = (int)lVar14 * 0x13;
  uVar6 = (uint)bVar5;
  if (uVar3 <= uVar7) {
    if (uVar3 < uVar7) {
      iVar15 = -0x8000000000000000;
      if (bVar4) {
        iVar15 = 0x7fffffffffffffff;
      }
      *pNum = iVar15;
      uVar6 = 2;
    }
    else {
      uVar11 = 0;
      pbVar13 = pbVar9;
      do {
        bVar1 = *pbVar13;
        bVar2 = "922337203685477580"[uVar11];
        if (0x10 < uVar11) break;
        uVar11 = uVar11 + 1;
        pbVar13 = pbVar13 + lVar14;
      } while (bVar1 == bVar2);
      if (bVar1 == bVar2) {
        iVar8 = (char)pbVar9[lVar14 * 0x12] + -0x38;
      }
      else {
        iVar8 = ((int)(char)bVar1 - (int)(char)bVar2) * 10;
      }
      uVar6 = (uint)bVar5;
      if (-1 < iVar8) {
        iVar15 = -0x8000000000000000;
        if (bVar4) {
          iVar15 = 0x7fffffffffffffff;
        }
        *pNum = iVar15;
        uVar6 = (uint)bVar5;
        if (bVar4) {
          uVar6 = 3;
        }
        if (iVar8 != 0) {
          uVar6 = 2;
        }
      }
    }
  }
  return uVar6;
}

Assistant:

SQLITE_PRIVATE int sqlite3Atoi64(const char *zNum, i64 *pNum, int length, u8 enc){
  int incr;
  u64 u = 0;
  int neg = 0; /* assume positive */
  int i;
  int c = 0;
  int nonNum = 0;  /* True if input contains UTF16 with high byte non-zero */
  int rc;          /* Baseline return code */
  const char *zStart;
  const char *zEnd = zNum + length;
  assert( enc==SQLITE_UTF8 || enc==SQLITE_UTF16LE || enc==SQLITE_UTF16BE );
  if( enc==SQLITE_UTF8 ){
    incr = 1;
  }else{
    incr = 2;
    assert( SQLITE_UTF16LE==2 && SQLITE_UTF16BE==3 );
    for(i=3-enc; i<length && zNum[i]==0; i+=2){}
    nonNum = i<length;
    zEnd = &zNum[i^1];
    zNum += (enc&1);
  }
  while( zNum<zEnd && sqlite3Isspace(*zNum) ) zNum+=incr;
  if( zNum<zEnd ){
    if( *zNum=='-' ){
      neg = 1;
      zNum+=incr;
    }else if( *zNum=='+' ){
      zNum+=incr;
    }
  }
  zStart = zNum;
  while( zNum<zEnd && zNum[0]=='0' ){ zNum+=incr; } /* Skip leading zeros. */
  for(i=0; &zNum[i]<zEnd && (c=zNum[i])>='0' && c<='9'; i+=incr){
    u = u*10 + c - '0';
  }
  testcase( i==18*incr );
  testcase( i==19*incr );
  testcase( i==20*incr );
  if( u>LARGEST_INT64 ){
    /* This test and assignment is needed only to suppress UB warnings
    ** from clang and -fsanitize=undefined.  This test and assignment make
    ** the code a little larger and slower, and no harm comes from omitting
    ** them, but we must appaise the undefined-behavior pharisees. */
    *pNum = neg ? SMALLEST_INT64 : LARGEST_INT64;
  }else if( neg ){
    *pNum = -(i64)u;
  }else{
    *pNum = (i64)u;
  }
  rc = 0;
  if( (i==0 && zStart==zNum)     /* No digits */
   || nonNum                     /* UTF16 with high-order bytes non-zero */
  ){
    rc = 1;
  }else if( &zNum[i]<zEnd ){     /* Extra bytes at the end */
    int jj = i;
    do{
      if( !sqlite3Isspace(zNum[jj]) ){
        rc = 1;          /* Extra non-space text after the integer */
        break;
      }
      jj += incr;
    }while( &zNum[jj]<zEnd );
  }
  if( i<19*incr ){
    /* Less than 19 digits, so we know that it fits in 64 bits */
    assert( u<=LARGEST_INT64 );
    return rc;
  }else{
    /* zNum is a 19-digit numbers.  Compare it against 9223372036854775808. */
    c = i>19*incr ? 1 : compare2pow63(zNum, incr);
    if( c<0 ){
      /* zNum is less than 9223372036854775808 so it fits */
      assert( u<=LARGEST_INT64 );
      return rc;
    }else{
      *pNum = neg ? SMALLEST_INT64 : LARGEST_INT64;
      if( c>0 ){
        /* zNum is greater than 9223372036854775808 so it overflows */
        return 2;
      }else{
        /* zNum is exactly 9223372036854775808.  Fits if negative.  The
        ** special case 2 overflow if positive */
        assert( u-1==LARGEST_INT64 );
        return neg ? rc : 3;
      }
    }
  }
}